

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult GenValidUsageInputsXrSubmitDebugUtilsMessageEXT
                   (XrInstance instance,XrDebugUtilsMessageSeverityFlagsEXT messageSeverity,
                   XrDebugUtilsMessageTypeFlagsEXT messageTypes,
                   XrDebugUtilsMessengerCallbackDataEXT *callbackData)

{
  GenValidUsageXrInstanceInfo *pGVar1;
  ValidateXrHandleResult VVar2;
  allocator local_949;
  string local_948 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_928;
  allocator local_909;
  string local_908 [39];
  allocator local_8e1;
  string local_8e0 [39];
  allocator local_8b9;
  string local_8b8 [39];
  allocator local_891;
  string local_890 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_870;
  allocator local_851;
  string local_850 [39];
  allocator local_829;
  string local_828 [32];
  string local_808 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_7e8;
  allocator local_7c9;
  string local_7c8 [39];
  allocator local_7a1;
  string local_7a0 [32];
  string local_780 [32];
  ostringstream local_760 [8];
  ostringstream oss_enum_1;
  allocator local_5e1;
  string local_5e0 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_5c0;
  allocator local_5a1;
  string local_5a0 [39];
  allocator local_579;
  string local_578 [36];
  ValidateXrFlagsResult local_554;
  string local_550 [4];
  ValidateXrFlagsResult debug_utils_message_type_flags_ext_result;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_530;
  allocator local_511;
  string local_510 [39];
  allocator local_4e9;
  string local_4e8 [32];
  string local_4c8 [32];
  ostringstream local_4a8 [8];
  ostringstream oss_enum;
  allocator local_329;
  string local_328 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_308;
  allocator local_2e9;
  string local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [36];
  ValidateXrFlagsResult local_29c;
  GenValidUsageXrInstanceInfo *pGStack_298;
  ValidateXrFlagsResult debug_utils_message_severity_flags_ext_result;
  GenValidUsageXrInstanceInfo *gen_instance_info;
  string local_288 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_268;
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [32];
  XrInstance_T local_200 [32];
  ostringstream local_1e0 [8];
  ostringstream oss;
  ValidateXrHandleResult handle_result;
  XrObjectType local_54;
  undefined1 local_50 [8];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  XrResult xr_result;
  XrDebugUtilsMessengerCallbackDataEXT *callbackData_local;
  XrDebugUtilsMessageTypeFlagsEXT messageTypes_local;
  XrDebugUtilsMessageSeverityFlagsEXT messageSeverity_local;
  XrInstance instance_local;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  messageSeverity_local = (XrDebugUtilsMessageSeverityFlagsEXT)instance;
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_50);
  local_54 = XR_OBJECT_TYPE_INSTANCE;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrInstance_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)local_50
             ,(XrInstance_T **)&messageSeverity_local,&local_54);
  VVar2 = VerifyXrInstanceHandle((XrInstance *)&messageSeverity_local);
  if (VVar2 == VALIDATE_XR_HANDLE_SUCCESS) {
    pGStack_298 = HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>::get
                            (&g_instance_info.
                              super_HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>,
                             (XrInstance_T *)messageSeverity_local);
    local_29c = ValidateXrDebugUtilsMessageSeverityFlagsEXT(messageSeverity);
    pGVar1 = pGStack_298;
    if (local_29c == VALIDATE_XR_FLAGS_ZERO) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2c0,"VUID-xrSubmitDebugUtilsMessageEXT-messageSeverity-requiredbitmask",
                 &local_2c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2e8,"xrSubmitDebugUtilsMessageEXT",&local_2e9);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_308,
                 (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 local_50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_328,
                 "XrDebugUtilsMessageSeverityFlagsEXT \"messageSeverity\" flag must be non-zero",
                 &local_329);
      CoreValidLogMessage(pGVar1,(string *)local_2c0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          (string *)local_2e8,&local_308,(string *)local_328);
      std::__cxx11::string::~string(local_328);
      std::allocator<char>::~allocator((allocator<char> *)&local_329);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_308);
      std::__cxx11::string::~string(local_2e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
      std::__cxx11::string::~string(local_2c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
      instance_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      gen_instance_info._4_4_ = 1;
    }
    else if (local_29c == VALIDATE_XR_FLAGS_SUCCESS) {
      local_554 = ValidateXrDebugUtilsMessageTypeFlagsEXT(messageTypes);
      pGVar1 = pGStack_298;
      if (local_554 == VALIDATE_XR_FLAGS_ZERO) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_578,"VUID-xrSubmitDebugUtilsMessageEXT-messageTypes-requiredbitmask",
                   &local_579);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_5a0,"xrSubmitDebugUtilsMessageEXT",&local_5a1);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_5c0,
                   (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   local_50);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_5e0,
                   "XrDebugUtilsMessageTypeFlagsEXT \"messageTypes\" flag must be non-zero",
                   &local_5e1);
        CoreValidLogMessage(pGVar1,(string *)local_578,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            (string *)local_5a0,&local_5c0,(string *)local_5e0);
        std::__cxx11::string::~string(local_5e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_5c0);
        std::__cxx11::string::~string(local_5a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
        std::__cxx11::string::~string(local_578);
        std::allocator<char>::~allocator((allocator<char> *)&local_579);
        instance_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
        gen_instance_info._4_4_ = 1;
      }
      else if (local_554 == VALIDATE_XR_FLAGS_SUCCESS) {
        if (callbackData == (XrDebugUtilsMessengerCallbackDataEXT *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_828,"VUID-xrSubmitDebugUtilsMessageEXT-callbackData-parameter",&local_829
                    );
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_850,"xrSubmitDebugUtilsMessageEXT",&local_851);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    (&local_870,
                     (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)local_50);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_890,
                     "Invalid NULL for XrDebugUtilsMessengerCallbackDataEXT \"callbackData\" which is not optional and must be non-NULL"
                     ,&local_891);
          CoreValidLogMessage(pGVar1,(string *)local_828,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              (string *)local_850,&local_870,(string *)local_890);
          std::__cxx11::string::~string(local_890);
          std::allocator<char>::~allocator((allocator<char> *)&local_891);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
          ~vector(&local_870);
          std::__cxx11::string::~string(local_850);
          std::allocator<char>::~allocator((allocator<char> *)&local_851);
          std::__cxx11::string::~string(local_828);
          std::allocator<char>::~allocator((allocator<char> *)&local_829);
          instance_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
          gen_instance_info._4_4_ = 1;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_8b8,"xrSubmitDebugUtilsMessageEXT",&local_8b9);
          objects_info.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
               ValidateXrStruct(pGVar1,(string *)local_8b8,
                                (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                 *)local_50,true,true,callbackData);
          std::__cxx11::string::~string(local_8b8);
          std::allocator<char>::~allocator((allocator<char> *)&local_8b9);
          pGVar1 = pGStack_298;
          if (objects_info.
              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == XR_SUCCESS) {
            instance_local._4_4_ =
                 objects_info.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
            gen_instance_info._4_4_ = 1;
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_8e0,"VUID-xrSubmitDebugUtilsMessageEXT-callbackData-parameter",
                       &local_8e1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_908,"xrSubmitDebugUtilsMessageEXT",&local_909);
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            vector(&local_928,
                   (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   local_50);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_948,
                       "Command xrSubmitDebugUtilsMessageEXT param callbackData is invalid",
                       &local_949);
            CoreValidLogMessage(pGVar1,(string *)local_8e0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                (string *)local_908,&local_928,(string *)local_948);
            std::__cxx11::string::~string(local_948);
            std::allocator<char>::~allocator((allocator<char> *)&local_949);
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            ~vector(&local_928);
            std::__cxx11::string::~string(local_908);
            std::allocator<char>::~allocator((allocator<char> *)&local_909);
            std::__cxx11::string::~string(local_8e0);
            std::allocator<char>::~allocator((allocator<char> *)&local_8e1);
            instance_local._4_4_ =
                 objects_info.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
            gen_instance_info._4_4_ = 1;
          }
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_760);
        std::operator<<((ostream *)local_760,
                        "Invalid XrDebugUtilsMessageTypeFlagsEXT \"messageTypes\" flag value ");
        Uint32ToHexString_abi_cxx11_((uint32_t)local_780);
        std::operator<<((ostream *)local_760,local_780);
        std::__cxx11::string::~string(local_780);
        std::operator<<((ostream *)local_760," contains illegal bit");
        pGVar1 = pGStack_298;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_7a0,"VUID-xrSubmitDebugUtilsMessageEXT-messageTypes-parameter",&local_7a1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_7c8,"xrSubmitDebugUtilsMessageEXT",&local_7c9);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_7e8,
                   (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   local_50);
        std::__cxx11::ostringstream::str();
        CoreValidLogMessage(pGVar1,(string *)local_7a0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            (string *)local_7c8,&local_7e8,local_808);
        std::__cxx11::string::~string((string *)local_808);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_7e8);
        std::__cxx11::string::~string(local_7c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_7c9);
        std::__cxx11::string::~string(local_7a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_7a1);
        instance_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
        gen_instance_info._4_4_ = 1;
        std::__cxx11::ostringstream::~ostringstream(local_760);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_4a8);
      std::operator<<((ostream *)local_4a8,
                      "Invalid XrDebugUtilsMessageSeverityFlagsEXT \"messageSeverity\" flag value ")
      ;
      Uint32ToHexString_abi_cxx11_((uint32_t)local_4c8);
      std::operator<<((ostream *)local_4a8,local_4c8);
      std::__cxx11::string::~string(local_4c8);
      std::operator<<((ostream *)local_4a8," contains illegal bit");
      pGVar1 = pGStack_298;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_4e8,"VUID-xrSubmitDebugUtilsMessageEXT-messageSeverity-parameter",&local_4e9)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_510,"xrSubmitDebugUtilsMessageEXT",&local_511);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_530,
                 (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 local_50);
      std::__cxx11::ostringstream::str();
      CoreValidLogMessage(pGVar1,(string *)local_4e8,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          (string *)local_510,&local_530,local_550);
      std::__cxx11::string::~string((string *)local_550);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_530);
      std::__cxx11::string::~string(local_510);
      std::allocator<char>::~allocator((allocator<char> *)&local_511);
      std::__cxx11::string::~string(local_4e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
      instance_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      gen_instance_info._4_4_ = 1;
      std::__cxx11::ostringstream::~ostringstream(local_4a8);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1e0);
    std::operator<<((ostream *)local_1e0,"Invalid XrInstance handle \"instance\" ");
    HandleToHexString<XrInstance_T*>(local_200);
    std::operator<<((ostream *)local_1e0,(string *)local_200);
    std::__cxx11::string::~string((string *)local_200);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_220,"VUID-xrSubmitDebugUtilsMessageEXT-instance-parameter",&local_221);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_248,"xrSubmitDebugUtilsMessageEXT",&local_249);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_268,
               (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               local_50);
    std::__cxx11::ostringstream::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,(string *)local_220,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,(string *)local_248,&local_268,local_288);
    std::__cxx11::string::~string((string *)local_288);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
              (&local_268);
    std::__cxx11::string::~string(local_248);
    std::allocator<char>::~allocator((allocator<char> *)&local_249);
    std::__cxx11::string::~string(local_220);
    std::allocator<char>::~allocator((allocator<char> *)&local_221);
    instance_local._4_4_ = XR_ERROR_HANDLE_INVALID;
    gen_instance_info._4_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1e0);
  }
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_50);
  return instance_local._4_4_;
}

Assistant:

XrResult GenValidUsageInputsXrSubmitDebugUtilsMessageEXT(
XrInstance instance,
XrDebugUtilsMessageSeverityFlagsEXT messageSeverity,
XrDebugUtilsMessageTypeFlagsEXT messageTypes,
const XrDebugUtilsMessengerCallbackDataEXT* callbackData) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(instance, XR_OBJECT_TYPE_INSTANCE);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrInstanceHandle(&instance);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrInstance handle \"instance\" ";
                oss << HandleToHexString(instance);
                CoreValidLogMessage(nullptr, "VUID-xrSubmitDebugUtilsMessageEXT-instance-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrSubmitDebugUtilsMessageEXT",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        GenValidUsageXrInstanceInfo *gen_instance_info = g_instance_info.get(instance);
        (void)gen_instance_info;  // quiet warnings
        ValidateXrFlagsResult debug_utils_message_severity_flags_ext_result = ValidateXrDebugUtilsMessageSeverityFlagsEXT(messageSeverity);
        // Flags must be non-zero in this case.
        if (VALIDATE_XR_FLAGS_ZERO == debug_utils_message_severity_flags_ext_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrSubmitDebugUtilsMessageEXT-messageSeverity-requiredbitmask",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrSubmitDebugUtilsMessageEXT",
                                objects_info, "XrDebugUtilsMessageSeverityFlagsEXT \"messageSeverity\" flag must be non-zero");
            return XR_ERROR_VALIDATION_FAILURE;
        } else if (VALIDATE_XR_FLAGS_SUCCESS != debug_utils_message_severity_flags_ext_result) {
            // Otherwise, flags must be valid.
            std::ostringstream oss_enum;
            oss_enum << "Invalid XrDebugUtilsMessageSeverityFlagsEXT \"messageSeverity\" flag value ";
            oss_enum << Uint32ToHexString(static_cast<uint32_t>(messageSeverity));
            oss_enum <<" contains illegal bit";
            CoreValidLogMessage(gen_instance_info, "VUID-xrSubmitDebugUtilsMessageEXT-messageSeverity-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrSubmitDebugUtilsMessageEXT",
                                objects_info, oss_enum.str());
            return XR_ERROR_VALIDATION_FAILURE;
        }
        ValidateXrFlagsResult debug_utils_message_type_flags_ext_result = ValidateXrDebugUtilsMessageTypeFlagsEXT(messageTypes);
        // Flags must be non-zero in this case.
        if (VALIDATE_XR_FLAGS_ZERO == debug_utils_message_type_flags_ext_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrSubmitDebugUtilsMessageEXT-messageTypes-requiredbitmask",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrSubmitDebugUtilsMessageEXT",
                                objects_info, "XrDebugUtilsMessageTypeFlagsEXT \"messageTypes\" flag must be non-zero");
            return XR_ERROR_VALIDATION_FAILURE;
        } else if (VALIDATE_XR_FLAGS_SUCCESS != debug_utils_message_type_flags_ext_result) {
            // Otherwise, flags must be valid.
            std::ostringstream oss_enum;
            oss_enum << "Invalid XrDebugUtilsMessageTypeFlagsEXT \"messageTypes\" flag value ";
            oss_enum << Uint32ToHexString(static_cast<uint32_t>(messageTypes));
            oss_enum <<" contains illegal bit";
            CoreValidLogMessage(gen_instance_info, "VUID-xrSubmitDebugUtilsMessageEXT-messageTypes-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrSubmitDebugUtilsMessageEXT",
                                objects_info, oss_enum.str());
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == callbackData) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrSubmitDebugUtilsMessageEXT-callbackData-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrSubmitDebugUtilsMessageEXT", objects_info,
                                "Invalid NULL for XrDebugUtilsMessengerCallbackDataEXT \"callbackData\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate that the structure XrDebugUtilsMessengerCallbackDataEXT is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrSubmitDebugUtilsMessageEXT", objects_info,
                                                        true, true, callbackData);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrSubmitDebugUtilsMessageEXT-callbackData-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrSubmitDebugUtilsMessageEXT",
                                objects_info,
                                "Command xrSubmitDebugUtilsMessageEXT param callbackData is invalid");
            return xr_result;
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}